

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int vs_ue(bitstream *str,uint32_t *val)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong in_RAX;
  uint size;
  undefined4 uStack_38;
  uint32_t tmp;
  
  if (str->dir == VS_ENCODE) {
    _uStack_38 = in_RAX & 0xffffffff;
    if (*val == 0xffffffff) {
      fwrite("Exp-Golomb number larger than 2^32-2\n",0x25,1,_stderr);
      iVar3 = 1;
    }
    else {
      iVar1 = 0;
      iVar3 = 1;
      do {
        if (*val < (2 << ((byte)iVar1 & 0x1f)) - 1U) {
          _uStack_38 = CONCAT44(1,uStack_38);
          iVar3 = vs_u(str,&tmp,1);
          if (iVar3 != 0) {
            return 1;
          }
          _uStack_38 = CONCAT44((-1 << ((byte)iVar1 & 0x1f)) + *val + 1,uStack_38);
          iVar3 = vs_u(str,&tmp,iVar1);
          return iVar3;
        }
        iVar1 = iVar1 + 1;
        iVar2 = vs_u(str,&tmp,1);
      } while (iVar2 == 0);
    }
  }
  else {
    size = 0xffffffff;
    iVar3 = 1;
    _uStack_38 = in_RAX;
    do {
      iVar1 = vs_u(str,&tmp,1);
      if (iVar1 != 0) {
        return 1;
      }
      size = size + 1;
    } while (tmp == 0);
    if (size < 0x20) {
      iVar1 = vs_u(str,&tmp,size);
      if (iVar1 == 0) {
        *val = ~(-1 << ((byte)size & 0x1f)) + tmp;
        iVar3 = 0;
      }
    }
    else {
      fwrite("Exp-Golomb number larger than 2^32-2\n",0x25,1,_stderr);
    }
  }
  return iVar3;
}

Assistant:

int vs_ue(struct bitstream *str, uint32_t *val) {
	int lzb = 0;
	uint32_t tmp;
	if (str->dir == VS_ENCODE) {
		tmp = 0;
		if (*val >= (uint32_t)0xffffffff) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		while (*val >= (uint32_t)(1u << (lzb + 1)) - 1) {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		}
		tmp = 1;
		if (vs_u(str, &tmp, 1))
			return 1;
		tmp = *val - ((1 << lzb) - 1);
		if (vs_u(str, &tmp, lzb))
			return 1;
		return 0;
	} else {
		do {
			if (vs_u(str, &tmp, 1))
				return 1;
			lzb++;
		} while (!tmp);
		lzb--;
		if (lzb > 31) {
			fprintf (stderr, "Exp-Golomb number larger than 2^32-2\n");
			return 1;
		}
		if (vs_u(str, &tmp, lzb))
			return 1;
		*val = tmp + (1u << lzb) - 1;
		return 0;
	}
}